

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsectoreffect.cpp
# Opt level: O3

EMoveResult __thiscall
sector_t::MoveCeiling
          (sector_t *this,double speed,double dest,int crush,int direction,bool hexencrush)

{
  double dVar1;
  undefined4 uVar2;
  bool bVar3;
  uint uVar4;
  double dVar5;
  double local_58;
  undefined8 local_48;
  
  dVar1 = (this->ceilingplane).D;
  local_48._4_4_ = (uint)((ulong)speed >> 0x20);
  local_48._0_4_ = SUB84(speed,0);
  uVar2 = (undefined4)local_48;
  if (direction == 1) {
    dVar5 = dVar1 - (this->ceilingplane).normal.Z * speed;
    if (dVar5 < dest) {
      bVar3 = MoveAttached(this,crush,speed,1,true);
      if (!bVar3) {
        return crushed;
      }
      (this->ceilingplane).D = dVar5;
      bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,speed,1,false);
      if (!bVar3) {
        this->planes[1].TexZ =
             ((this->ceilingplane).D - dVar1) * (this->ceilingplane).negiC + this->planes[1].TexZ;
        return ok;
      }
      (this->ceilingplane).D = dVar1;
      uVar4 = local_48._4_4_ ^ 0x80000000;
      local_48 = -speed;
      goto LAB_00381f91;
    }
    dVar5 = (dest - dVar1) * (this->ceilingplane).negiC;
    bVar3 = MoveAttached(this,crush,dVar5,1,true);
    if (!bVar3) {
      return crushed;
    }
    (this->ceilingplane).D = dest;
    bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,dVar5,1,false);
    if (!bVar3) goto LAB_003821af;
    (this->ceilingplane).D = dVar1;
    P_ChangeSector((sector_t_conflict *)this,crush,dVar5,1,true);
    P_Scroll3dMidtex((sector_t_conflict *)this,crush,dVar5,true);
  }
  else {
    if (direction != -1) {
      return ok;
    }
    dVar5 = (this->ceilingplane).normal.X;
    if ((((((dVar5 == 0.0) && (!NAN(dVar5))) &&
          (dVar5 = (this->ceilingplane).normal.Y, dVar5 == 0.0)) &&
         ((!NAN(dVar5) && (dVar5 = (this->floorplane).normal.X, dVar5 == 0.0)))) &&
        ((!NAN(dVar5) && ((dVar5 = (this->floorplane).normal.Y, dVar5 == 0.0 && (!NAN(dVar5)))))))
       && ((sectorPortals.Array[this->Portals[0]].mType != 3 &&
           ((((byte)i_compatflags2 & 2) == 0 && (dVar5 = -(this->floorplane).D, dest < dVar5)))))) {
      dest = dVar5;
    }
    dVar5 = (this->ceilingplane).normal.Z * speed + dVar1;
    if (dest < dVar5) {
      bVar3 = MoveAttached(this,crush,-speed,1,true);
      if (!bVar3) {
        return crushed;
      }
      (this->ceilingplane).D = dVar5;
      bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,-speed,1,false);
      if (!bVar3) {
        this->planes[1].TexZ =
             ((this->ceilingplane).D - dVar1) * (this->ceilingplane).negiC + this->planes[1].TexZ;
        return ok;
      }
      if (-1 < crush && !hexencrush) {
        this->planes[1].TexZ =
             ((this->ceilingplane).D - dVar1) * (this->ceilingplane).negiC + this->planes[1].TexZ;
        return crushed;
      }
      (this->ceilingplane).D = dVar1;
      uVar4 = local_48._4_4_;
      local_48 = speed;
LAB_00381f91:
      P_ChangeSector((sector_t_conflict *)this,crush,(double)CONCAT44(uVar4,uVar2),1,true);
      P_Scroll3dMidtex((sector_t_conflict *)this,crush,local_48,true);
      P_MoveLinkedSectors((sector_t_conflict *)this,crush,local_48,true);
      return crushed;
    }
    dVar5 = (dest - dVar1) * (this->ceilingplane).negiC;
    bVar3 = MoveAttached(this,crush,dVar5,1,true);
    if (!bVar3) {
      return crushed;
    }
    (this->ceilingplane).D = dest;
    bVar3 = P_ChangeSector((sector_t_conflict *)this,crush,dVar5,1,false);
    if (!bVar3) {
LAB_003821af:
      this->planes[1].TexZ = dVar5 + this->planes[1].TexZ;
      return pastdest;
    }
    (this->ceilingplane).D = dVar1;
    local_58 = -dVar5;
    P_ChangeSector((sector_t_conflict *)this,crush,-dVar5,1,true);
    P_Scroll3dMidtex((sector_t_conflict *)this,crush,local_58,true);
    dVar5 = local_58;
  }
  P_MoveLinkedSectors((sector_t_conflict *)this,crush,dVar5,true);
  return pastdest;
}

Assistant:

EMoveResult sector_t::MoveCeiling(double speed, double dest, int crush, int direction, bool hexencrush)
{
	bool	 	flag;
	double 	lastpos;
	double		movedest;
	double		move;
	//double		destheight;	//jff 02/04/98 used to keep floors/ceilings
	// from moving thru each other

	lastpos = ceilingplane.fD();
	switch (direction)
	{
	case -1:
		// DOWN
		// jff 02/04/98 keep ceiling from moving thru floors
		// [RH] not so easy with arbitrary planes
		//destheight = (dest > floorheight) ? dest : floorheight;
		if (!ceilingplane.isSlope() && !floorplane.isSlope() &&
			!PortalIsLinked(sector_t::floor) &&
			(!(i_compatflags2 & COMPATF2_FLOORMOVE) && dest < -floorplane.fD()))
		{
			dest = -floorplane.fD();
		}
		movedest = ceilingplane.GetChangedHeight (-speed);
		if (movedest <= dest)
		{
			move = ceilingplane.HeightDiff (lastpos, dest);

			if (!MoveAttached(crush, move, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(dest);
			flag = P_ChangeSector (this, crush, move, 1, false);

			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, -move, 1, true);
				MoveAttached(crush, -move, 1, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::ceiling, move);
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, -speed, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(movedest);

			// COULD GET CRUSHED
			flag = P_ChangeSector (this, crush, -speed, 1, false);
			if (flag)
			{
				if (crush >= 0 && !hexencrush)
				{
					ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
					return EMoveResult::crushed;
				}
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, speed, 1, true);
				MoveAttached(crush, speed, 1, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
		}
		break;
												
	case 1:
		// UP
		movedest = ceilingplane.GetChangedHeight (speed);
		if (movedest >= dest)
		{
			move = ceilingplane.HeightDiff (lastpos, dest);

			if (!MoveAttached(crush, move, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(dest);

			flag = P_ChangeSector (this, crush, move, 1, false);
			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, move, 1, true);
				MoveAttached(crush, move, 1, false);
			}
			else
			{
				ChangePlaneTexZ(sector_t::ceiling, move);
			}
			return EMoveResult::pastdest;
		}
		else
		{
			if (!MoveAttached(crush, speed, 1, true)) return EMoveResult::crushed;

			ceilingplane.setD(movedest);

			flag = P_ChangeSector (this, crush, speed, 1, false);
			if (flag)
			{
				ceilingplane.setD(lastpos);
				P_ChangeSector (this, crush, -speed, 1, true);
				MoveAttached(crush, -speed, 1, false);
				return EMoveResult::crushed;
			}
			ChangePlaneTexZ(sector_t::ceiling, ceilingplane.HeightDiff (lastpos));
		}
		break;
	}
	return EMoveResult::ok;
}